

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

bool __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::matches
          (call_matcher<void_(),_std::tuple<>_> *this,call_params_type_t<void_()> *params)

{
  list_elem<trompeloeil::condition_base<void_()>_> *plVar1;
  int iVar2;
  
  plVar1 = &(this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>;
  do {
    plVar1 = plVar1->next;
    if (plVar1 == &(this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>) break;
    iVar2 = (*plVar1->_vptr_list_elem[2])(plVar1,params);
  } while ((char)iVar2 != '\0');
  return plVar1 == &(this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>;
}

Assistant:

bool
    matches(
      call_params_type_t<Sig> const& params)
    const
    override
    {
      return match_parameters(val, params) && match_conditions(params);
    }